

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableSetColumnSortDirection
               (int column_n,ImGuiSortDirection sort_direction,bool append_to_sort_specs)

{
  ImGuiTableColumn *pIVar1;
  char cVar2;
  ImGuiTable *table;
  ImGuiTableColumn *pIVar3;
  ImGuiTableColumn *pIVar4;
  ImGuiTableColumnIdx IVar5;
  ulong uVar6;
  ulong uVar7;
  char cVar8;
  byte bVar9;
  int other_column_n;
  long lVar10;
  long lVar11;
  
  table = GImGui->CurrentTable;
  bVar9 = *(byte *)((long)&table->Flags + 3) >> 2 & append_to_sort_specs;
  uVar6 = 0;
  if (bVar9 == 1) {
    uVar7 = (ulong)(uint)table->ColumnsCount;
    if (table->ColumnsCount < 1) {
      uVar7 = uVar6;
    }
    cVar8 = '\0';
    for (; uVar7 * 0x68 - uVar6 != 0; uVar6 = uVar6 + 0x68) {
      cVar2 = (&((table->Columns).Data)->SortOrder)[uVar6];
      if (cVar2 < cVar8) {
        cVar2 = cVar8;
      }
      cVar8 = cVar2;
    }
    uVar6 = (ulong)(byte)(cVar8 + 1);
  }
  IVar5 = (ImGuiTableColumnIdx)uVar6;
  pIVar3 = (table->Columns).Data;
  pIVar1 = pIVar3 + column_n;
  pIVar3[column_n].field_0x65 = pIVar3[column_n].field_0x65 & 0xfc | (byte)sort_direction & 3;
  if ((sort_direction & 3U) == 0) {
    IVar5 = -1;
  }
  else if ((bVar9 & pIVar1->SortOrder != -1) != 0) goto LAB_002081b8;
  pIVar1->SortOrder = IVar5;
LAB_002081b8:
  lVar11 = 0;
  for (lVar10 = 0; lVar10 < table->ColumnsCount; lVar10 = lVar10 + 1) {
    pIVar4 = (table->Columns).Data;
    pIVar3 = (ImGuiTableColumn *)((long)&pIVar4->Flags + lVar11);
    if (pIVar3 != pIVar1 && bVar9 == 0) {
      (&pIVar4->SortOrder)[lVar11] = -1;
    }
    TableFixColumnSortDirection(table,pIVar3);
    lVar11 = lVar11 + 0x68;
  }
  table->IsSettingsDirty = true;
  table->IsSortSpecsDirty = true;
  return;
}

Assistant:

void ImGui::TableSetColumnSortDirection(int column_n, ImGuiSortDirection sort_direction, bool append_to_sort_specs)
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;

    if (!(table->Flags & ImGuiTableFlags_SortMulti))
        append_to_sort_specs = false;
    if (!(table->Flags & ImGuiTableFlags_SortTristate))
        IM_ASSERT(sort_direction != ImGuiSortDirection_None);

    ImGuiTableColumnIdx sort_order_max = 0;
    if (append_to_sort_specs)
        for (int other_column_n = 0; other_column_n < table->ColumnsCount; other_column_n++)
            sort_order_max = ImMax(sort_order_max, table->Columns[other_column_n].SortOrder);

    ImGuiTableColumn* column = &table->Columns[column_n];
    column->SortDirection = (ImU8)sort_direction;
    if (column->SortDirection == ImGuiSortDirection_None)
        column->SortOrder = -1;
    else if (column->SortOrder == -1 || !append_to_sort_specs)
        column->SortOrder = append_to_sort_specs ? sort_order_max + 1 : 0;

    for (int other_column_n = 0; other_column_n < table->ColumnsCount; other_column_n++)
    {
        ImGuiTableColumn* other_column = &table->Columns[other_column_n];
        if (other_column != column && !append_to_sort_specs)
            other_column->SortOrder = -1;
        TableFixColumnSortDirection(table, other_column);
    }
    table->IsSettingsDirty = true;
    table->IsSortSpecsDirty = true;
}